

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmNinjaTargetGenerator::LanguageScanRule
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *lang,string *config)

{
  string *name;
  char local_a9;
  string local_a8;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  
  local_58.View_._M_str = (lang->_M_dataplus)._M_p;
  local_58.View_._M_len = lang->_M_string_length;
  local_88.View_._M_len = 7;
  local_88.View_._M_str = "_SCAN__";
  name = cmGeneratorTarget::GetName_abi_cxx11_
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  cmGlobalNinjaGenerator::EncodeRuleName(&local_a8,name);
  local_a9 = '_';
  cmStrCat<std::__cxx11::string,char,std::__cxx11::string>
            (__return_storage_ptr__,&local_58,&local_88,&local_a8,&local_a9,config);
  std::__cxx11::string::~string((string *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::LanguageScanRule(
  std::string const& lang, const std::string& config) const
{
  return cmStrCat(
    lang, "_SCAN__",
    cmGlobalNinjaGenerator::EncodeRuleName(this->GeneratorTarget->GetName()),
    '_', config);
}